

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alffplay.cpp
# Opt level: O0

int __thiscall anon_unknown.dwarf_f6f6::VideoState::handler(VideoState *this)

{
  mutex_type **ppmVar1;
  unique_lock<std::mutex> *puVar2;
  bool bVar3;
  iterator pvVar4;
  iterator pvVar5;
  ulong *puVar6;
  pointer pAVar7;
  ostream *this_00;
  void *this_01;
  size_type sVar8;
  long in_RDI;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> lock_1;
  double frame_delay;
  int ret_1;
  AVFrame *decoded_frame;
  Picture *vp;
  size_t write_idx;
  duration<long,_std::ratio<1L,_1000000000L>_> current_pts;
  lock_guard<std::mutex> _;
  int ret;
  memory_order __b_1;
  memory_order __b_3;
  memory_order __b_2;
  memory_order __b;
  undefined7 in_stack_fffffffffffffe48;
  byte in_stack_fffffffffffffe4f;
  unique_lock<std::mutex> *in_stack_fffffffffffffe50;
  atomic<bool> *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  PacketQueue<14680064UL> *in_stack_fffffffffffffea8;
  duration<double,std::ratio<1l,1l>> local_100 [8];
  rep local_f8;
  AVRational local_f0;
  double local_e8;
  AVRational local_e0;
  double local_d8;
  duration<double,std::ratio<1l,1l>> local_d0 [8];
  rep local_c8;
  int local_bc;
  pointer local_b8;
  reference local_b0;
  unique_lock<std::mutex> *local_a8;
  nanoseconds local_a0 [3];
  rep local_88;
  int local_78;
  unique_lock<std::mutex> *local_68;
  memory_order local_60;
  int local_5c;
  unique_lock<std::mutex> *local_58;
  ulong *local_50;
  unique_lock<std::mutex> *local_48;
  memory_order local_40;
  int local_3c;
  atomic<bool> *local_38;
  unique_lock<std::mutex> *local_30;
  memory_order local_28;
  int local_24;
  ulong *local_20;
  unique_lock<std::mutex> *local_18;
  memory_order local_10;
  int local_c;
  ulong *local_8;
  
  pvVar4 = std::array<(anonymous_namespace)::VideoState::Picture,_24UL>::begin
                     ((array<(anonymous_namespace)::VideoState::Picture,_24UL> *)0x11441b);
  pvVar5 = std::array<(anonymous_namespace)::VideoState::Picture,_24UL>::end
                     ((array<(anonymous_namespace)::VideoState::Picture,_24UL> *)0x114437);
  std::
  for_each<(anonymous_namespace)::VideoState::Picture*,(anonymous_namespace)::VideoState::handler()::__0>
            (pvVar4,pvVar5);
  do {
    std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::get
              ((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
               in_stack_fffffffffffffe50);
    local_78 = PacketQueue<14680064UL>::sendTo
                         (in_stack_fffffffffffffea8,
                          (AVCodecContext *)
                          CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    if (local_78 == -0xb) break;
  } while (local_78 != -0x20464f45);
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_fffffffffffffe50,
             (mutex_type *)CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48));
  local_88 = (rep)get_avtime();
  *(rep *)(in_RDI + 0xd8) = local_88;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1144fa);
  memset(local_a0,0,8);
  while (bVar3 = std::atomic<bool>::load
                           (in_stack_fffffffffffffe58,
                            (memory_order)((ulong)in_stack_fffffffffffffe50 >> 0x20)),
        ((bVar3 ^ 0xffU) & 1) != 0) {
    puVar6 = (ulong *)(in_RDI + 0x298);
    local_c = 0;
    local_8 = puVar6;
    local_10 = std::operator&(memory_order_relaxed,__memory_order_mask);
    if (local_c - 1U < 2) {
      local_18 = (unique_lock<std::mutex> *)*puVar6;
    }
    else if (local_c == 5) {
      local_18 = (unique_lock<std::mutex> *)*puVar6;
    }
    else {
      local_18 = (unique_lock<std::mutex> *)*puVar6;
    }
    local_a8 = local_18;
    local_b0 = std::array<(anonymous_namespace)::VideoState::Picture,_24UL>::operator[]
                         ((array<(anonymous_namespace)::VideoState::Picture,_24UL> *)
                          in_stack_fffffffffffffe50,
                          CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48));
    local_b8 = std::unique_ptr<AVFrame,_(anonymous_namespace)::AVFrameDeleter>::get
                         ((unique_ptr<AVFrame,_(anonymous_namespace)::AVFrameDeleter> *)
                          in_stack_fffffffffffffe50);
    while( true ) {
      pAVar7 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::get
                         ((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                          in_stack_fffffffffffffe50);
      local_bc = avcodec_receive_frame(pAVar7,local_b8);
      if (local_bc != -0xb) break;
      in_stack_fffffffffffffea8 = (PacketQueue<14680064UL> *)(in_RDI + 0x18);
      std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::get
                ((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                 in_stack_fffffffffffffe50);
      PacketQueue<14680064UL>::sendTo
                (in_stack_fffffffffffffea8,
                 (AVCodecContext *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    }
    if (local_bc == 0) {
      if (local_b8->best_effort_timestamp != -0x8000000000000000) {
        local_e0 = *(AVRational *)(*(long *)(in_RDI + 8) + 0x18);
        local_d8 = av_q2d(local_e0);
        local_d8 = local_d8 * (double)local_b8->best_effort_timestamp;
        std::chrono::duration<double,std::ratio<1l,1l>>::duration<double,void>(local_d0,&local_d8);
        local_c8 = (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,double,std::ratio<1l,1l>>
                                  ((duration<double,_std::ratio<1L,_1L>_> *)
                                   CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48));
        local_a0[0].__r = local_c8;
      }
      (local_b0->mPts).__r = local_a0[0].__r;
      pAVar7 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::operator->
                         ((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                          0x11479f);
      local_f0 = pAVar7->time_base;
      local_e8 = av_q2d(local_f0);
      local_e8 = (double)local_b8->repeat_pict * local_e8 * 0.5 + local_e8;
      std::chrono::duration<double,std::ratio<1l,1l>>::duration<double,void>(local_100,&local_e8);
      local_f8 = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,double,std::ratio<1l,1l>>
                                ((duration<double,_std::ratio<1L,_1L>_> *)
                                 CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48));
      std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::operator+=
                ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffe50,
                 (duration<long,_std::ratio<1L,_1000000000L>_> *)
                 CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48));
      ppmVar1 = &local_a8->_M_device;
      sVar8 = std::array<(anonymous_namespace)::VideoState::Picture,_24UL>::size
                        ((array<(anonymous_namespace)::VideoState::Picture,_24UL> *)(in_RDI + 0x110)
                        );
      local_a8 = (unique_lock<std::mutex> *)((ulong)((long)ppmVar1 + 1U) % sVar8);
      puVar6 = (ulong *)(in_RDI + 0x298);
      local_5c = 3;
      local_58 = local_a8;
      local_50 = puVar6;
      local_60 = std::operator&(memory_order_release,__memory_order_mask);
      local_68 = local_58;
      if (local_5c == 3) {
        *puVar6 = (ulong)local_58;
      }
      else if (local_5c == 5) {
        LOCK();
        *puVar6 = (ulong)local_58;
        UNLOCK();
      }
      else {
        *puVar6 = (ulong)local_58;
      }
      in_stack_fffffffffffffea4 = local_5c;
      std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::get
                ((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                 in_stack_fffffffffffffe50);
      PacketQueue<14680064UL>::sendTo
                (in_stack_fffffffffffffea8,
                 (AVCodecContext *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
      puVar2 = local_a8;
      puVar6 = (ulong *)(in_RDI + 0x290);
      local_24 = 2;
      local_20 = puVar6;
      local_28 = std::operator&(memory_order_acquire,__memory_order_mask);
      if (local_24 - 1U < 2) {
        local_30 = (unique_lock<std::mutex> *)*puVar6;
      }
      else if (local_24 == 5) {
        local_30 = (unique_lock<std::mutex> *)*puVar6;
      }
      else {
        local_30 = (unique_lock<std::mutex> *)*puVar6;
      }
      if (puVar2 == local_30) {
        std::unique_lock<std::mutex>::unique_lock
                  (in_stack_fffffffffffffe50,
                   (mutex_type *)CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48));
        while( true ) {
          in_stack_fffffffffffffe58 = (atomic<bool> *)(in_RDI + 0x290);
          local_3c = 2;
          in_stack_fffffffffffffe50 = local_a8;
          local_38 = in_stack_fffffffffffffe58;
          local_40 = std::operator&(memory_order_acquire,__memory_order_mask);
          if (local_3c - 1U < 2) {
            local_48 = *(unique_lock<std::mutex> **)in_stack_fffffffffffffe58;
          }
          else if (local_3c == 5) {
            local_48 = *(unique_lock<std::mutex> **)in_stack_fffffffffffffe58;
          }
          else {
            local_48 = *(unique_lock<std::mutex> **)in_stack_fffffffffffffe58;
          }
          in_stack_fffffffffffffe4f = 0;
          if (in_stack_fffffffffffffe50 == local_48) {
            bVar3 = std::atomic<bool>::load
                              (in_stack_fffffffffffffe58,
                               (memory_order)((ulong)in_stack_fffffffffffffe50 >> 0x20));
            in_stack_fffffffffffffe4f = bVar3 ^ 0xff;
          }
          if ((in_stack_fffffffffffffe4f & 1) == 0) break;
          std::condition_variable::wait((unique_lock *)(in_RDI + 0x2c8));
        }
        std::unique_lock<std::mutex>::~unique_lock(in_stack_fffffffffffffe50);
      }
    }
    else {
      if (local_bc == -0x20464f45) break;
      this_00 = std::operator<<((ostream *)&std::cerr,"Failed to receive frame: ");
      this_01 = (void *)std::ostream::operator<<(this_00,local_bc);
      std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    }
  }
  std::atomic<bool>::operator=
            ((atomic<bool> *)in_stack_fffffffffffffe50,(bool)in_stack_fffffffffffffe4f);
  std::unique_lock<std::mutex>::unique_lock
            (in_stack_fffffffffffffe50,
             (mutex_type *)CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48));
  while (bVar3 = std::atomic::operator_cast_to_bool(in_stack_fffffffffffffe58),
        ((bVar3 ^ 0xffU) & 1) != 0) {
    std::condition_variable::wait((unique_lock *)(in_RDI + 0x2c8));
  }
  std::unique_lock<std::mutex>::~unique_lock(in_stack_fffffffffffffe50);
  return 0;
}

Assistant:

int VideoState::handler()
{
    std::for_each(mPictQ.begin(), mPictQ.end(),
        [](Picture &pict) -> void
        { pict.mFrame = AVFramePtr{av_frame_alloc()}; });

    /* Prefill the codec buffer. */
    do {
        const int ret{mPackets.sendTo(mCodecCtx.get())};
        if(ret == AVERROR(EAGAIN) || ret == AVErrorEOF)
            break;
    } while(1);

    {
        std::lock_guard<std::mutex> _{mDispPtsMutex};
        mDisplayPtsTime = get_avtime();
    }

    auto current_pts = nanoseconds::zero();
    while(!mMovie.mQuit.load(std::memory_order_relaxed))
    {
        size_t write_idx{mPictQWrite.load(std::memory_order_relaxed)};
        Picture *vp{&mPictQ[write_idx]};

        /* Retrieve video frame. */
        AVFrame *decoded_frame{vp->mFrame.get()};
        int ret;
        while((ret=avcodec_receive_frame(mCodecCtx.get(), decoded_frame)) == AVERROR(EAGAIN))
            mPackets.sendTo(mCodecCtx.get());
        if(ret != 0)
        {
            if(ret == AVErrorEOF) break;
            std::cerr<< "Failed to receive frame: "<<ret <<std::endl;
            continue;
        }

        /* Get the PTS for this frame. */
        if(decoded_frame->best_effort_timestamp != AVNoPtsValue)
            current_pts = duration_cast<nanoseconds>(seconds_d64{av_q2d(mStream->time_base) *
                static_cast<double>(decoded_frame->best_effort_timestamp)});
        vp->mPts = current_pts;

        /* Update the video clock to the next expected PTS. */
        auto frame_delay = av_q2d(mCodecCtx->time_base);
        frame_delay += decoded_frame->repeat_pict * (frame_delay * 0.5);
        current_pts += duration_cast<nanoseconds>(seconds_d64{frame_delay});

        /* Put the frame in the queue to be loaded into a texture and displayed
         * by the rendering thread.
         */
        write_idx = (write_idx+1)%mPictQ.size();
        mPictQWrite.store(write_idx, std::memory_order_release);

        /* Send a packet now so it's hopefully ready by the time it's needed. */
        mPackets.sendTo(mCodecCtx.get());

        if(write_idx == mPictQRead.load(std::memory_order_acquire))
        {
            /* Wait until we have space for a new pic */
            std::unique_lock<std::mutex> lock{mPictQMutex};
            while(write_idx == mPictQRead.load(std::memory_order_acquire) &&
                !mMovie.mQuit.load(std::memory_order_relaxed))
                mPictQCond.wait(lock);
        }
    }
    mEOS = true;

    std::unique_lock<std::mutex> lock{mPictQMutex};
    while(!mFinalUpdate) mPictQCond.wait(lock);

    return 0;
}